

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O1

int __thiscall DIS::ExpendableReload::getMarshalledSize(ExpendableReload *this)

{
  int iVar1;
  
  iVar1 = EntityType::getMarshalledSize(&this->_expendable);
  return iVar1 + 0x10;
}

Assistant:

int ExpendableReload::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + _expendable.getMarshalledSize();  // _expendable
   marshalSize = marshalSize + 4;  // _station
   marshalSize = marshalSize + 2;  // _standardQuantity
   marshalSize = marshalSize + 2;  // _maximumQuantity
   marshalSize = marshalSize + 4;  // _standardQuantityReloadTime
   marshalSize = marshalSize + 4;  // _maximumQuantityReloadTime
    return marshalSize;
}